

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  char cVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  int iVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  long lVar53;
  int in_ECX;
  int iVar54;
  uint subpel_q4;
  int iVar55;
  uint uVar56;
  long lVar57;
  int iVar58;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_16b_3;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_clip_1;
  __m256i res_16b_2;
  __m256i round_result_hi;
  __m256i round_result_lo;
  __m256i comp_avg_res_hi;
  __m256i comp_avg_res_lo;
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i data_01_1;
  __m256i data_1_1;
  __m256i data_0_1;
  __m256i res_unsigned_hi;
  __m256i res_b_round;
  __m256i res_b;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_16b_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_clip;
  __m256i res_16b;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i data_01;
  __m256i data_1;
  __m256i data_0;
  __m256i res_unsigned_lo;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s7;
  __m256i s6;
  int16_t *data;
  __m256i s5;
  __m256i s4;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i res;
  __m256i res_odd1;
  __m256i res_even1;
  __m256i res_odd;
  __m256i res_even;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  __m256i clip_pixel_to_bd;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  __m128i round_shift_y;
  __m256i round_const_y;
  __m128i round_shift_x;
  __m256i round_const_x;
  __m256i zero;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i coeffs_x [4];
  __m256i coeffs_y [4];
  __m256i s [8];
  uint16_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int j;
  int i;
  int im_stride;
  int im_h;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int16_t im_block [1120];
  undefined4 local_1fac;
  uint uVar62;
  uint round_shift;
  undefined3 in_stack_ffffffffffffe070;
  undefined4 uVar63;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  __m256i *in_stack_ffffffffffffe0c8;
  __m256i *in_stack_ffffffffffffe0d0;
  __m256i *in_stack_ffffffffffffe0d8;
  __m256i *wt0_00;
  undefined1 local_1f20 [32];
  __m256i *palStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  byte local_1904;
  byte local_18d4;
  int local_15bc;
  int local_15b8;
  undefined8 local_15a0 [7];
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 uStack_1540;
  undefined8 uStack_1538;
  undefined8 auStack_1530 [267];
  int local_cd4;
  int local_cd0;
  int local_ccc;
  long local_cc8;
  int local_cbc;
  undefined1 local_cb0 [16];
  uint local_c94;
  undefined1 local_c90 [16];
  uint local_c7c;
  uint local_c78;
  uint local_c74;
  uint local_c70;
  uint local_c6c;
  uint local_c68;
  uint local_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  ushort local_c12;
  undefined1 (*local_c10) [32];
  undefined1 (*local_c08) [32];
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined1 (*local_bc8) [32];
  undefined8 local_bc0;
  ulong uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  ulong uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  ulong uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 *local_598;
  undefined1 (*local_590) [16];
  undefined1 (*local_588) [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  ulong local_560;
  undefined8 uStack_558;
  ulong local_550;
  undefined8 uStack_548;
  ulong local_540;
  undefined8 uStack_538;
  ulong *local_528;
  ulong local_520;
  undefined8 uStack_518;
  ulong *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  __m256i *local_4e0;
  __m256i *palStack_4d8;
  undefined8 uStack_4d0;
  __m256i *palStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 *local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 *local_438;
  undefined8 *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 *local_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 *local_3b8;
  undefined8 local_3b0;
  __m256i *palStack_3a8;
  undefined8 *local_398;
  __m256i *local_390;
  __m256i *palStack_388;
  undefined8 *local_378;
  ulong local_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  ulong local_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  ulong local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  ulong local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [32];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  __m256i *res_unsigned;
  __m256i *data_ref_0_00;
  
  iVar37 = (int)conv_params;
  lVar4 = *(long *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 8);
  iVar2 = *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x10);
  iVar1 = in_R9D + -1 + (uint)filter_params_x->taps;
  lVar53 = in_RDI + (long)(int)(((filter_params_x->taps >> 1) - 1) * in_ESI) * -2 +
           (long)(int)((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1) * -2;
  iVar3 = *(int *)CONCAT44(in_stack_0000002c,subpel_y_qn);
  uVar62 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x28);
  round_shift = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x2c);
  auVar5 = vpinsrd_avx(ZEXT416(uVar62),uVar62,1);
  auVar5 = vpinsrd_avx(auVar5,uVar62,2);
  local_200 = vpinsrd_avx(auVar5,uVar62,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar62),uVar62,1);
  auVar5 = vpinsrd_avx(auVar5,uVar62,2);
  auStack_1f0 = vpinsrd_avx(auVar5,uVar62,3);
  auVar5 = vpinsrd_avx(ZEXT416(round_shift),round_shift,1);
  auVar5 = vpinsrd_avx(auVar5,round_shift,2);
  local_1c0 = vpinsrd_avx(auVar5,round_shift,3);
  auVar5 = vpinsrd_avx(ZEXT416(round_shift),round_shift,1);
  auVar5 = vpinsrd_avx(auVar5,round_shift,2);
  auStack_1b0 = vpinsrd_avx(auVar5,round_shift,3);
  local_c40._8_8_ = SUB328(ZEXT832(0),4);
  uVar40 = local_c40._8_8_;
  iVar54 = (1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) & 0x1f)) >> 1;
  subpel_q4 = iVar54 + (1 << ((char)conv_params + 6U & 0x1f));
  auVar5 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar5 = vpinsrd_avx(auVar5,subpel_q4,2);
  auVar5 = vpinsrd_avx(auVar5,subpel_q4,3);
  auVar6 = vpinsrd_avx(ZEXT416(subpel_q4),subpel_q4,1);
  auVar6 = vpinsrd_avx(auVar6,subpel_q4,2);
  auStack_170 = vpinsrd_avx(auVar6,subpel_q4,3);
  local_180._0_8_ = auVar5._0_8_;
  uVar41 = local_180._0_8_;
  local_180._8_8_ = auVar5._8_8_;
  uVar42 = local_180._8_8_;
  uVar43 = auStack_170._0_8_;
  uVar44 = auStack_170._8_8_;
  local_c7c = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14);
  local_c90._4_4_ = 0;
  local_c90._0_4_ = local_c7c;
  uVar39 = local_c90._0_8_;
  iVar55 = (1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f)) >> 1;
  uVar56 = iVar55 - (1 << (((char)conv_params -
                           (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14)) +
                           0xdU & 0x1f));
  auVar6 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar6 = vpinsrd_avx(auVar6,uVar56,2);
  auVar6 = vpinsrd_avx(auVar6,uVar56,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar7 = vpinsrd_avx(auVar7,uVar56,2);
  auStack_130 = vpinsrd_avx(auVar7,uVar56,3);
  local_140._0_8_ = auVar6._0_8_;
  uVar45 = local_140._0_8_;
  local_140._8_8_ = auVar6._8_8_;
  uVar46 = local_140._8_8_;
  uVar47 = auStack_130._0_8_;
  uVar48 = auStack_130._8_8_;
  local_c94 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
  local_cb0._4_4_ = 0;
  local_cb0._0_4_ = local_c94;
  uVar38 = local_cb0._0_8_;
  cVar28 = ((char)conv_params -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14)) -
           (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
  local_18d4 = cVar28 + 0xe;
  uVar63 = CONCAT13(local_18d4,in_stack_ffffffffffffe070);
  iVar58 = 1 << (local_18d4 & 0x1f);
  local_c74 = iVar58 + (1 << (cVar28 + 0xdU & 0x1f));
  auVar7 = vpinsrd_avx(ZEXT416(local_c74),local_c74,1);
  auVar7 = vpinsrd_avx(auVar7,local_c74,2);
  auVar7 = vpinsrd_avx(auVar7,local_c74,3);
  auVar8 = vpinsrd_avx(ZEXT416(local_c74),local_c74,1);
  auVar8 = vpinsrd_avx(auVar8,local_c74,2);
  auStack_f0 = vpinsrd_avx(auVar8,local_c74,3);
  local_100._0_8_ = auVar7._0_8_;
  uVar49 = local_100._0_8_;
  local_100._8_8_ = auVar7._8_8_;
  uVar50 = local_100._8_8_;
  uVar51 = auStack_f0._0_8_;
  uVar52 = auStack_f0._8_8_;
  local_1904 = 0xe - ((char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
                     (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
  local_c78 = (1 << (local_1904 & 0x1f)) >> 1;
  auVar8 = vpinsrd_avx(ZEXT416(local_c78),local_c78,1);
  auVar8 = vpinsrd_avx(auVar8,local_c78,2);
  auVar8 = vpinsrd_avx(auVar8,local_c78,3);
  auVar9 = vpinsrd_avx(ZEXT416(local_c78),local_c78,1);
  auVar9 = vpinsrd_avx(auVar9,local_c78,2);
  auVar9 = vpinsrd_avx(auVar9,local_c78,3);
  local_c0._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar9;
  local_c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  if (iVar37 == 10) {
    local_1fac = 0x3ff;
  }
  else {
    local_1fac = 0xff;
    if (iVar37 == 0xc) {
      local_1fac = 0xfff;
    }
  }
  local_c12 = (ushort)local_1fac;
  auVar8 = vpinsrw_avx(ZEXT216(local_c12),local_1fac,1);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,2);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,3);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,4);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,5);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,6);
  auVar8 = vpinsrw_avx(auVar8,local_1fac,7);
  auVar9 = vpinsrw_avx(ZEXT216(local_c12),local_1fac,1);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,2);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,3);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,4);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,5);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,6);
  auVar9 = vpinsrw_avx(auVar9,local_1fac,7);
  auVar59._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar9;
  auVar59._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  local_cd4 = in_R9D;
  local_cd0 = in_R8D;
  local_ccc = in_ECX;
  local_cc8 = in_RDX;
  local_cbc = in_ESI;
  local_cb0 = ZEXT416(local_c94);
  local_c90 = ZEXT416(local_c7c);
  local_c70 = uVar56;
  local_c6c = subpel_q4;
  local_c68 = round_shift;
  local_c64 = uVar62;
  local_c40 = ZEXT832(0) << 0x20;
  local_1e0 = uVar62;
  local_1dc = uVar62;
  local_1d8 = uVar62;
  local_1d4 = uVar62;
  local_1d0 = uVar62;
  local_1cc = uVar62;
  local_1c8 = uVar62;
  local_1c4 = uVar62;
  local_1a0 = round_shift;
  local_19c = round_shift;
  local_198 = round_shift;
  local_194 = round_shift;
  local_190 = round_shift;
  local_18c = round_shift;
  local_188 = round_shift;
  local_184 = round_shift;
  local_180 = auVar5;
  local_160 = subpel_q4;
  local_15c = subpel_q4;
  local_158 = subpel_q4;
  local_154 = subpel_q4;
  local_150 = subpel_q4;
  local_14c = subpel_q4;
  local_148 = subpel_q4;
  local_144 = subpel_q4;
  local_140 = auVar6;
  local_120 = uVar56;
  local_11c = uVar56;
  local_118 = uVar56;
  local_114 = uVar56;
  local_110 = uVar56;
  local_10c = uVar56;
  local_108 = uVar56;
  local_104 = uVar56;
  local_100 = auVar7;
  local_e0 = local_c74;
  local_dc = local_c74;
  local_d8 = local_c74;
  local_d4 = local_c74;
  local_d0 = local_c74;
  local_cc = local_c74;
  local_c8 = local_c74;
  local_c4 = local_c74;
  local_a0 = local_c78;
  local_9c = local_c78;
  local_98 = local_c78;
  local_94 = local_c78;
  local_90 = local_c78;
  local_8c = local_c78;
  local_88 = local_c78;
  local_84 = local_c78;
  local_80 = auVar59;
  local_50 = local_c12;
  local_4e = local_c12;
  local_4c = local_c12;
  local_4a = local_c12;
  local_48 = local_c12;
  local_46 = local_c12;
  local_44 = local_c12;
  local_42 = local_c12;
  local_40 = local_c12;
  local_3e = local_c12;
  local_3c = local_c12;
  local_3a = local_c12;
  local_38 = local_c12;
  local_36 = local_c12;
  local_34 = local_c12;
  local_32 = local_c12;
  prepare_coeffs((InterpFilterParams *)CONCAT44(uVar56,iVar55),subpel_q4,
                 (__m256i *)CONCAT44(round_shift,uVar62));
  prepare_coeffs((InterpFilterParams *)CONCAT44(uVar56,iVar55),subpel_q4,
                 (__m256i *)CONCAT44(round_shift,uVar62));
  for (local_15bc = 0; local_15bc < local_cd0; local_15bc = local_15bc + 8) {
    for (local_15b8 = 0; local_15b8 < iVar1; local_15b8 = local_15b8 + 2) {
      local_bc8 = (undefined1 (*) [32])(lVar53 + (long)(local_15b8 * local_cbc + local_15bc) * 2);
      local_c60._8_8_ = SUB328(ZEXT832(0),4);
      local_19a0 = 0;
      uStack_1998 = local_c60._8_8_;
      uStack_1990 = 0;
      uStack_1988 = 0;
      if (local_15b8 + 1 < iVar1) {
        local_bd0 = (undefined8 *)(lVar53 + (long)((local_15b8 + 1) * local_cbc + local_15bc) * 2);
        local_19a0 = *local_bd0;
        uStack_1998 = local_bd0[1];
        uStack_1990 = local_bd0[2];
        uStack_1988 = local_bd0[3];
      }
      auVar16._8_8_ = uStack_1998;
      auVar16._0_8_ = local_19a0;
      auVar16._16_8_ = uStack_1990;
      auVar16._24_8_ = uStack_1988;
      auVar10 = vperm2i128_avx2(*local_bc8,auVar16,0x20);
      auVar17._8_8_ = uStack_1998;
      auVar17._0_8_ = local_19a0;
      auVar17._16_8_ = uStack_1990;
      auVar17._24_8_ = uStack_1988;
      auVar11 = vperm2i128_avx2(*local_bc8,auVar17,0x31);
      vpalignr_avx2(auVar11,auVar10,4);
      vpalignr_avx2(auVar11,auVar10,8);
      auVar60 = vpalignr_avx2(auVar11,auVar10,0xc);
      local_c60 = ZEXT832(0) << 0x20;
      convolve(in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8);
      local_1a00 = auVar60._0_8_;
      uStack_19f8 = auVar60._8_8_;
      uStack_19f0 = auVar60._16_8_;
      uStack_19e8 = auVar60._24_8_;
      local_760 = local_1a00;
      uStack_758 = uStack_19f8;
      uStack_750 = uStack_19f0;
      uStack_748 = uStack_19e8;
      local_780 = uVar41;
      uStack_778 = uVar42;
      uStack_770 = uVar43;
      uStack_768 = uVar44;
      auVar23._16_8_ = uVar43;
      auVar23._0_16_ = auVar5;
      auVar23._24_8_ = uVar44;
      local_2a0 = vpaddd_avx2(auVar60,auVar23);
      local_2b0 = uVar39;
      uStack_2a8 = 0;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar39;
      auVar61 = vpsrad_avx2(local_2a0,auVar27);
      vpalignr_avx2(auVar11,auVar10,2);
      vpalignr_avx2(auVar11,auVar10,6);
      vpalignr_avx2(auVar11,auVar10,10);
      auVar60 = vpalignr_avx2(auVar11,auVar10,0xe);
      convolve(in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8);
      local_1a20 = auVar60._0_8_;
      uStack_1a18 = auVar60._8_8_;
      uStack_1a10 = auVar60._16_8_;
      uStack_1a08 = auVar60._24_8_;
      local_7a0 = local_1a20;
      uStack_798 = uStack_1a18;
      uStack_790 = uStack_1a10;
      uStack_788 = uStack_1a08;
      local_7c0 = uVar41;
      uStack_7b8 = uVar42;
      uStack_7b0 = uVar43;
      uStack_7a8 = uVar44;
      auVar22._16_8_ = uVar43;
      auVar22._0_16_ = auVar5;
      auVar22._24_8_ = uVar44;
      local_2e0 = vpaddd_avx2(auVar60,auVar22);
      local_2f0 = uVar39;
      uStack_2e8 = 0;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar39;
      auVar10 = vpsrad_avx2(local_2e0,auVar26);
      local_1a00 = auVar61._0_8_;
      uStack_19f8 = auVar61._8_8_;
      uStack_19f0 = auVar61._16_8_;
      uStack_19e8 = auVar61._24_8_;
      local_220 = local_1a00;
      uStack_218 = uStack_19f8;
      uStack_210 = uStack_19f0;
      uStack_208 = uStack_19e8;
      local_240 = local_1a00;
      uStack_238 = uStack_19f8;
      uStack_230 = uStack_19f0;
      uStack_228 = uStack_19e8;
      auVar60 = vpackssdw_avx2(auVar61,auVar61);
      local_1a20 = auVar10._0_8_;
      uStack_1a18 = auVar10._8_8_;
      uStack_1a10 = auVar10._16_8_;
      uStack_1a08 = auVar10._24_8_;
      local_260 = local_1a20;
      uStack_258 = uStack_1a18;
      uStack_250 = uStack_1a10;
      uStack_248 = uStack_1a08;
      local_280 = local_1a20;
      uStack_278 = uStack_1a18;
      uStack_270 = uStack_1a10;
      uStack_268 = uStack_1a08;
      auVar61 = vpackssdw_avx2(auVar10,auVar10);
      local_1a40 = auVar60._0_8_;
      uStack_1a38 = auVar60._8_8_;
      uStack_1a30 = auVar60._16_8_;
      uStack_1a28 = auVar60._24_8_;
      local_1a60 = auVar61._0_8_;
      uStack_1a58 = auVar61._8_8_;
      uStack_1a50 = auVar61._16_8_;
      uStack_1a48 = auVar61._24_8_;
      local_a20 = local_1a40;
      uStack_a18 = uStack_1a38;
      uStack_a10 = uStack_1a30;
      uStack_a08 = uStack_1a28;
      local_a40 = local_1a60;
      uStack_a38 = uStack_1a58;
      uStack_a30 = uStack_1a50;
      uStack_a28 = uStack_1a48;
      auVar60 = vpunpcklwd_avx2(auVar60,auVar61);
      lVar57 = (long)(local_15b8 * 8) * 2;
      local_598 = (undefined8 *)((long)local_15a0 + lVar57);
      local_1a80 = auVar60._0_8_;
      uStack_1a78 = auVar60._8_8_;
      uStack_1a70 = auVar60._16_8_;
      uStack_1a68 = auVar60._24_8_;
      local_5c0 = local_1a80;
      uStack_5b8 = uStack_1a78;
      uStack_5b0 = uStack_1a70;
      uStack_5a8 = uStack_1a68;
      *local_598 = local_1a80;
      *(undefined8 *)((long)local_15a0 + lVar57 + 8) = uStack_1a78;
      *(undefined8 *)((long)local_15a0 + lVar57 + 0x10) = uStack_1a70;
      *(undefined8 *)((long)local_15a0 + lVar57 + 0x18) = uStack_1a68;
    }
    local_bd8 = local_15a0;
    auVar61._8_8_ = local_15a0[1];
    auVar61._0_8_ = local_15a0[0];
    auVar61._16_8_ = local_15a0[2];
    auVar61._24_8_ = local_15a0[3];
    auVar60._8_8_ = local_15a0[1];
    auVar60._0_8_ = local_15a0[0];
    auVar60._16_8_ = local_15a0[2];
    auVar60._24_8_ = local_15a0[3];
    local_be0 = local_15a0 + 2;
    auVar11._8_8_ = local_15a0[3];
    auVar11._0_8_ = local_15a0[2];
    auVar11._16_8_ = local_15a0[4];
    auVar11._24_8_ = local_15a0[5];
    auVar10._8_8_ = local_15a0[3];
    auVar10._0_8_ = local_15a0[2];
    auVar10._16_8_ = local_15a0[4];
    auVar10._24_8_ = local_15a0[5];
    local_be8 = local_15a0 + 4;
    auVar30._8_8_ = local_15a0[5];
    auVar30._0_8_ = local_15a0[4];
    auVar30._16_8_ = local_15a0[6];
    auVar30._24_8_ = uStack_1568;
    auVar29._8_8_ = local_15a0[5];
    auVar29._0_8_ = local_15a0[4];
    auVar29._16_8_ = local_15a0[6];
    auVar29._24_8_ = uStack_1568;
    local_bf0 = local_15a0 + 6;
    auVar32._8_8_ = uStack_1568;
    auVar32._0_8_ = local_15a0[6];
    auVar32._16_8_ = local_1560;
    auVar32._24_8_ = uStack_1558;
    auVar31._8_8_ = uStack_1568;
    auVar31._0_8_ = local_15a0[6];
    auVar31._16_8_ = local_1560;
    auVar31._24_8_ = uStack_1558;
    local_bf8 = &local_1560;
    auVar34._8_8_ = uStack_1558;
    auVar34._0_8_ = local_1560;
    auVar34._16_8_ = uStack_1550;
    auVar34._24_8_ = uStack_1548;
    auVar33._8_8_ = uStack_1558;
    auVar33._0_8_ = local_1560;
    auVar33._16_8_ = uStack_1550;
    auVar33._24_8_ = uStack_1548;
    local_c00 = &uStack_1550;
    auVar36._8_8_ = uStack_1548;
    auVar36._0_8_ = uStack_1550;
    auVar36._16_8_ = uStack_1540;
    auVar36._24_8_ = uStack_1538;
    auVar35._8_8_ = uStack_1548;
    auVar35._0_8_ = uStack_1550;
    auVar35._16_8_ = uStack_1540;
    auVar35._24_8_ = uStack_1538;
    vpunpcklwd_avx2(auVar60,auVar10);
    vpunpcklwd_avx2(auVar29,auVar31);
    vpunpcklwd_avx2(auVar33,auVar35);
    vpunpckhwd_avx2(auVar61,auVar11);
    vpunpckhwd_avx2(auVar30,auVar32);
    vpunpckhwd_avx2(auVar34,auVar36);
    for (local_15b8 = 0; local_15b8 < local_cd4; local_15b8 = local_15b8 + 2) {
      lVar57 = (long)(local_15b8 * 8) * 2;
      local_c08 = (undefined1 (*) [32])((long)&uStack_1540 + lVar57);
      local_b20 = *(undefined8 *)*local_c08;
      uStack_b18 = *(undefined8 *)((long)auStack_1530 + lVar57 + -8);
      uStack_b10 = *(undefined8 *)((long)auStack_1530 + lVar57);
      uStack_b08 = *(undefined8 *)((long)auStack_1530 + lVar57 + 8);
      local_c10 = (undefined1 (*) [32])((long)auStack_1530 + lVar57);
      local_b40 = *(undefined8 *)*local_c10;
      uStack_b38 = *(undefined8 *)((long)auStack_1530 + lVar57 + 8);
      uStack_b30 = *(undefined8 *)((long)auStack_1530 + lVar57 + 0x10);
      uStack_b28 = *(undefined8 *)((long)auStack_1530 + lVar57 + 0x18);
      vpunpcklwd_avx2(*local_c08,*local_c10);
      auVar60 = vpunpckhwd_avx2(*local_c08,*local_c10);
      local_9c0 = local_b40;
      uStack_9b8 = uStack_b38;
      uStack_9b0 = uStack_b30;
      uStack_9a8 = uStack_b28;
      local_9a0 = local_b20;
      uStack_998 = uStack_b18;
      uStack_990 = uStack_b10;
      uStack_988 = uStack_b08;
      convolve(in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8);
      local_1bc0 = auVar60._0_8_;
      uStack_1bb8 = auVar60._8_8_;
      uStack_1bb0 = auVar60._16_8_;
      uStack_1ba8 = auVar60._24_8_;
      local_7e0 = local_1bc0;
      uStack_7d8 = uStack_1bb8;
      uStack_7d0 = uStack_1bb0;
      uStack_7c8 = uStack_1ba8;
      local_800 = uVar45;
      uStack_7f8 = uVar46;
      uStack_7f0 = uVar47;
      uStack_7e8 = uVar48;
      auVar21._16_8_ = uVar47;
      auVar21._0_16_ = auVar6;
      auVar21._24_8_ = uVar48;
      local_320 = vpaddd_avx2(auVar60,auVar21);
      local_330 = uVar38;
      uStack_328 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar38;
      auVar60 = vpsrad_avx2(local_320,auVar8);
      local_1be0 = auVar60._0_8_;
      uStack_1bd8 = auVar60._8_8_;
      uStack_1bd0 = auVar60._16_8_;
      uStack_1bc8 = auVar60._24_8_;
      local_820 = local_1be0;
      uStack_818 = uStack_1bd8;
      uStack_810 = uStack_1bd0;
      uStack_808 = uStack_1bc8;
      local_840 = uVar49;
      uStack_838 = uVar50;
      uStack_830 = uVar51;
      uStack_828 = uVar52;
      auVar20._16_8_ = uVar51;
      auVar20._0_16_ = auVar7;
      auVar20._24_8_ = uVar52;
      auVar60 = vpaddd_avx2(auVar60,auVar20);
      local_1c00 = auVar60._0_8_;
      uStack_1bf8 = auVar60._8_8_;
      uStack_1bf0 = auVar60._16_8_;
      uStack_1be8 = auVar60._24_8_;
      uStack_1950 = auVar59._16_8_;
      uStack_1948 = auVar59._24_8_;
      if (local_cd0 - local_15bc < 8) {
        if (iVar3 == 0) {
          local_6a0 = local_1c00;
          uStack_698 = uStack_1bf8;
          uStack_690 = uStack_1bf0;
          uStack_688 = uStack_1be8;
          local_6c0 = local_1c00;
          uStack_6b8 = uStack_1bf8;
          uStack_6b0 = uStack_1bf0;
          uStack_6a8 = uStack_1be8;
          auVar60 = vpackusdw_avx2(auVar60,auVar60);
          local_1d40 = auVar60._0_8_;
          uStack_1d38 = auVar60._8_8_;
          uStack_1d30 = auVar60._16_8_;
          uStack_1d28 = auVar60._24_8_;
          local_4c0 = local_1d40;
          uStack_4b8 = uStack_1d38;
          uStack_4b0 = uStack_1d30;
          uStack_4a8 = uStack_1d28;
          uStack_448 = uStack_1d28;
          local_450 = uStack_1d30;
          local_438 = (undefined8 *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc) * 2);
          *local_438 = uStack_1d30;
          local_458 = (undefined8 *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc + iVar2) * 2);
          *local_458 = local_1d60;
        }
        else {
          local_508 = (ulong *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc) * 2);
          local_550 = *local_508;
          uStack_518 = 0;
          uStack_548 = 0;
          local_528 = (ulong *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc + iVar2) * 2);
          local_560 = *local_528;
          uStack_538 = 0;
          uStack_558 = 0;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_550;
          auVar15._16_16_ = auVar7;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_560;
          auVar14._16_16_ = auVar7;
          auVar60 = vperm2i128_avx2(auVar15,auVar14,0x20);
          local_1c60 = auVar60._0_8_;
          uStack_1c58 = auVar60._8_8_;
          uStack_1c50 = auVar60._16_8_;
          uStack_1c48 = auVar60._24_8_;
          local_b60 = local_1c60;
          uStack_b58 = uStack_1c58;
          uStack_b50 = uStack_1c50;
          uStack_b48 = uStack_1c48;
          local_b80 = 0;
          uStack_b78 = uVar40;
          uStack_b70 = 0;
          uStack_b68 = 0;
          auVar60 = vpunpcklwd_avx2(auVar60,ZEXT832((ulong)uVar40) << 0x40);
          local_540 = local_560;
          local_520 = local_550;
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffe0d8,
                          (int)((ulong)in_stack_ffffffffffffe0d0 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar58,uVar63),(__m256i *)CONCAT44(uVar56,iVar55),
                     (__m256i *)CONCAT44(subpel_q4,iVar54),round_shift);
          local_1cc0 = auVar60._0_8_;
          uStack_1cb8 = auVar60._8_8_;
          uStack_1cb0 = auVar60._16_8_;
          uStack_1ca8 = auVar60._24_8_;
          local_660 = local_1cc0;
          uStack_658 = uStack_1cb8;
          uStack_650 = uStack_1cb0;
          uStack_648 = uStack_1ca8;
          local_680 = local_1cc0;
          uStack_678 = uStack_1cb8;
          uStack_670 = uStack_1cb0;
          uStack_668 = uStack_1ca8;
          auVar60 = vpackusdw_avx2(auVar60,auVar60);
          local_1ce0 = auVar60._0_8_;
          uStack_1cd8 = auVar60._8_8_;
          uStack_1cd0 = auVar60._16_8_;
          uStack_1cc8 = auVar60._24_8_;
          local_5e0 = local_1ce0;
          uStack_5d8 = uStack_1cd8;
          uStack_5d0 = uStack_1cd0;
          uStack_5c8 = uStack_1cc8;
          auVar25._16_8_ = uStack_1950;
          auVar25._0_16_ = auVar59._0_16_;
          auVar25._24_8_ = uStack_1948;
          auVar60 = vpminsw_avx2(auVar60,auVar25);
          local_1d00 = auVar60._0_8_;
          uStack_1cf8 = auVar60._8_8_;
          uStack_1cf0 = auVar60._16_8_;
          uStack_1ce8 = auVar60._24_8_;
          local_4a0 = local_1d00;
          uStack_498 = uStack_1cf8;
          uStack_490 = uStack_1cf0;
          uStack_488 = uStack_1ce8;
          uStack_408 = uStack_1ce8;
          local_410 = uStack_1cf0;
          local_3f8 = (undefined8 *)(local_cc8 + (long)(local_15b8 * local_ccc + local_15bc) * 2);
          *local_3f8 = uStack_1cf0;
          local_418 = (undefined8 *)
                      (local_cc8 + (long)(local_15b8 * local_ccc + local_15bc + local_ccc) * 2);
          *local_418 = local_1d20;
          local_600 = auVar59._0_16_;
          auStack_5f0 = auVar59._16_16_;
        }
      }
      else {
        auVar61 = auVar60;
        convolve(in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8);
        local_1d80 = auVar61._0_8_;
        uStack_1d78 = auVar61._8_8_;
        uStack_1d70 = auVar61._16_8_;
        uStack_1d68 = auVar61._24_8_;
        local_860 = local_1d80;
        uStack_858 = uStack_1d78;
        uStack_850 = uStack_1d70;
        uStack_848 = uStack_1d68;
        local_880 = uVar45;
        uStack_878 = uVar46;
        uStack_870 = uVar47;
        uStack_868 = uVar48;
        auVar19._16_8_ = uVar47;
        auVar19._0_16_ = auVar6;
        auVar19._24_8_ = uVar48;
        local_360 = vpaddd_avx2(auVar61,auVar19);
        local_370 = uVar38;
        uStack_368 = 0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar38;
        auVar61 = vpsrad_avx2(local_360,auVar9);
        local_1da0 = auVar61._0_8_;
        uStack_1d98 = auVar61._8_8_;
        uStack_1d90 = auVar61._16_8_;
        uStack_1d88 = auVar61._24_8_;
        local_8a0 = local_1da0;
        uStack_898 = uStack_1d98;
        uStack_890 = uStack_1d90;
        uStack_888 = uStack_1d88;
        local_8c0 = uVar49;
        uStack_8b8 = uVar50;
        uStack_8b0 = uVar51;
        uStack_8a8 = uVar52;
        auVar18._16_8_ = uVar51;
        auVar18._0_16_ = auVar7;
        auVar18._24_8_ = uVar52;
        auVar61 = vpaddd_avx2(auVar61,auVar18);
        if (iVar3 == 0) {
          local_1dc0 = auVar61._0_8_;
          uStack_1db8 = auVar61._8_8_;
          uStack_1db0 = auVar61._16_8_;
          uStack_1da8 = auVar61._24_8_;
          local_720 = local_1c00;
          uStack_718 = uStack_1bf8;
          uStack_710 = uStack_1bf0;
          uStack_708 = uStack_1be8;
          local_740 = local_1dc0;
          uStack_738 = uStack_1db8;
          uStack_730 = uStack_1db0;
          uStack_728 = uStack_1da8;
          auVar60 = vpackusdw_avx2(auVar60,auVar61);
          local_1f60 = auVar60._0_8_;
          uStack_1f58 = auVar60._8_8_;
          uStack_1f50 = auVar60._16_8_;
          uStack_1f48 = auVar60._24_8_;
          local_500 = local_1f60;
          uStack_4f8 = uStack_1f58;
          uStack_4f0 = uStack_1f50;
          uStack_4e8 = uStack_1f48;
          local_3b8 = (undefined8 *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc) * 2);
          local_3d0 = local_1f60;
          uStack_3c8 = uStack_1f58;
          *local_3b8 = local_1f60;
          local_3b8[1] = uStack_1f58;
          local_3d8 = (undefined8 *)(lVar4 + (long)(local_15b8 * iVar2 + local_15bc + iVar2) * 2);
          local_3f0 = uStack_1f50;
          uStack_3e8 = uStack_1f48;
          *local_3d8 = uStack_1f50;
          local_3d8[1] = uStack_1f48;
        }
        else {
          local_588 = (undefined1 (*) [16])(lVar4 + (long)(local_15b8 * iVar2 + local_15bc) * 2);
          local_570 = *(undefined8 *)*local_588;
          uStack_568 = *(undefined8 *)(*local_588 + 8);
          local_590 = (undefined1 (*) [16])
                      (lVar4 + (long)(local_15b8 * iVar2 + local_15bc + iVar2) * 2);
          local_580 = *(undefined8 *)*local_590;
          uStack_578 = *(undefined8 *)(*local_590 + 8);
          auVar13._16_16_ = auVar7;
          auVar13._0_16_ = *local_588;
          auVar12._16_16_ = auVar7;
          auVar12._0_16_ = *local_590;
          auVar60 = vperm2i128_avx2(auVar13,auVar12,0x20);
          local_1e20 = auVar60._0_8_;
          uStack_1e18 = auVar60._8_8_;
          uStack_1e10 = auVar60._16_8_;
          uStack_1e08 = auVar60._24_8_;
          local_ba0 = local_1e20;
          uStack_b98 = uStack_1e18;
          uStack_b90 = uStack_1e10;
          uStack_b88 = uStack_1e08;
          local_bc0 = 0;
          uStack_bb8 = uVar40;
          uStack_bb0 = 0;
          uStack_ba8 = 0;
          vpunpcklwd_avx2(auVar60,ZEXT832((ulong)uVar40) << 0x40);
          local_9e0 = local_1e20;
          uStack_9d8 = uStack_1e18;
          uStack_9d0 = uStack_1e10;
          uStack_9c8 = uStack_1e08;
          local_a00 = 0;
          uStack_9f8 = uVar40;
          uStack_9f0 = 0;
          uStack_9e8 = 0;
          auVar60 = vpunpckhwd_avx2(auVar60,ZEXT832((ulong)uVar40) << 0x40);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffe0d8,
                          (int)((ulong)in_stack_ffffffffffffe0d0 >> 0x20));
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffe0d8,
                          (int)((ulong)in_stack_ffffffffffffe0d0 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar58,uVar63),(__m256i *)CONCAT44(uVar56,iVar55),
                     (__m256i *)CONCAT44(subpel_q4,iVar54),round_shift);
          auVar61 = auVar60;
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(iVar58,uVar63),(__m256i *)CONCAT44(uVar56,iVar55),
                     (__m256i *)CONCAT44(subpel_q4,iVar54),round_shift);
          local_1ec0 = auVar60._0_8_;
          uStack_1eb8 = auVar60._8_8_;
          uStack_1eb0 = auVar60._16_8_;
          uStack_1ea8 = auVar60._24_8_;
          local_1ee0 = auVar61._0_8_;
          uStack_1ed8 = auVar61._8_8_;
          uStack_1ed0 = auVar61._16_8_;
          uStack_1ec8 = auVar61._24_8_;
          local_6e0 = local_1ec0;
          uStack_6d8 = uStack_1eb8;
          uStack_6d0 = uStack_1eb0;
          uStack_6c8 = uStack_1ea8;
          local_700 = local_1ee0;
          uStack_6f8 = uStack_1ed8;
          uStack_6f0 = uStack_1ed0;
          uStack_6e8 = uStack_1ec8;
          auVar60 = vpackusdw_avx2(auVar60,auVar61);
          local_1f00 = auVar60._0_8_;
          uStack_1ef8 = auVar60._8_8_;
          uStack_1ef0 = auVar60._16_8_;
          uStack_1ee8 = auVar60._24_8_;
          local_620 = local_1f00;
          uStack_618 = uStack_1ef8;
          uStack_610 = uStack_1ef0;
          uStack_608 = uStack_1ee8;
          auVar24._16_8_ = uStack_1950;
          auVar24._0_16_ = auVar59._0_16_;
          auVar24._24_8_ = uStack_1948;
          local_1f20 = vpminsw_avx2(auVar60,auVar24);
          palStack_4c8 = palStack_1f08;
          local_378 = (undefined8 *)(local_cc8 + (long)(local_15b8 * local_ccc + local_15bc) * 2);
          *local_378 = wt0_00;
          local_378[1] = res_unsigned;
          local_398 = (undefined8 *)
                      (local_cc8 + (long)(local_15b8 * local_ccc + local_15bc + local_ccc) * 2);
          palStack_3a8 = palStack_1f08;
          *local_398 = data_ref_0_00;
          local_398[1] = palStack_1f08;
          in_stack_ffffffffffffe0c8 = palStack_1f08;
          in_stack_ffffffffffffe0d0 = wt0_00;
          in_stack_ffffffffffffe0d8 = res_unsigned;
          local_4e0 = wt0_00;
          palStack_4d8 = res_unsigned;
          uStack_4d0 = data_ref_0_00;
          local_3b0 = data_ref_0_00;
          local_390 = wt0_00;
          palStack_388 = res_unsigned;
          local_640 = auVar59._0_16_;
          auStack_630 = auVar59._16_16_;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);

  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        const __m256i res_unsigned_lo =
            _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}